

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

DockPosition toDockPos(DockWidgetArea area)

{
  if (area - LeftDockWidgetArea < 8) {
    return *(DockPosition *)(&DAT_0065eee0 + (ulong)(area - LeftDockWidgetArea) * 4);
  }
  return DockCount;
}

Assistant:

static QInternal::DockPosition toDockPos(Qt::DockWidgetArea area)
{
    switch (area) {
        case Qt::LeftDockWidgetArea: return QInternal::LeftDock;
        case Qt::RightDockWidgetArea: return QInternal::RightDock;
        case Qt::TopDockWidgetArea: return QInternal::TopDock;
        case Qt::BottomDockWidgetArea: return QInternal::BottomDock;
        default:
            break;
    }

    return QInternal::DockCount;
}